

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_int>_>::Data
          (Data<QHashPrivate::Node<int,_int>_> *this,Data<QHashPrivate::Node<int,_int>_> *other,
          size_t reserved)

{
  Node<int,_int> *key;
  ulong uVar1;
  Span *pSVar2;
  ulong uVar3;
  Node<int,_int> *pNVar4;
  long lVar5;
  ulong uVar6;
  size_t numBuckets;
  long lVar7;
  long in_FS_OFFSET;
  R RVar8;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->numBuckets = 0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar5 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar5 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar8 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar8.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pSVar2 = other->spans;
      lVar7 = 0;
      do {
        uVar3 = (ulong)pSVar2->offsets[lVar7 + lVar5];
        if (uVar3 != 0xff) {
          key = (Node<int,_int> *)(pSVar2[uVar6].entries + uVar3);
          local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
          local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
          uVar3 = (long)key->key ^ this->seed;
          uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
          uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
          local_48 = findBucketWithHash<int>(this,(int *)key,uVar3 >> 0x20 ^ uVar3);
          pNVar4 = Bucket::insert(&local_48);
          *pNVar4 = *key;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x80);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (uVar6 != uVar1 >> 7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }